

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshot.cpp
# Opt level: O1

int __thiscall efsw::DirectorySnapshot::init(DirectorySnapshot *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,*(long *)ctx,*(long *)(ctx + 8) + *(long *)ctx);
  setDirectoryInfo(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  initFiles(this);
  return extraout_EAX;
}

Assistant:

void DirectorySnapshot::init( std::string directory ) {
	setDirectoryInfo( directory );
	initFiles();
}